

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::DrawTestShaderProgram::generateShaderParams
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *params,ContextType type)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  mapped_type *pmVar3;
  allocator<char> local_489;
  key_type local_488;
  allocator<char> local_461;
  key_type local_460;
  allocator<char> local_439;
  key_type local_438;
  allocator<char> local_411;
  key_type local_410;
  allocator<char> local_3e9;
  key_type local_3e8;
  allocator<char> local_3c1;
  key_type local_3c0;
  allocator<char> local_399;
  key_type local_398;
  deUint32 local_378;
  allocator<char> local_371;
  key_type local_370;
  allocator<char> local_349;
  key_type local_348;
  allocator<char> local_321;
  key_type local_320;
  allocator<char> local_2f9;
  key_type local_2f8;
  allocator<char> local_2d1;
  key_type local_2d0;
  allocator<char> local_2a9;
  key_type local_2a8;
  allocator<char> local_281;
  key_type local_280;
  ApiType local_260;
  allocator<char> local_259;
  key_type local_258;
  allocator<char> local_231;
  key_type local_230;
  allocator<char> local_209;
  key_type local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  key_type local_1b8;
  allocator<char> local_191;
  key_type local_190;
  allocator<char> local_169;
  key_type local_168;
  deUint32 local_148;
  allocator<char> local_141;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  allocator<char> local_79;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  ApiType local_1c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params_local;
  ContextType type_local;
  
  local_1c = type.super_ApiType.m_bits;
  local_18 = params;
  params_local._4_4_ = type.super_ApiType.m_bits;
  bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_300_ES);
  pmVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"VTX_IN",&local_41);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_40);
    std::__cxx11::string::operator=((string *)pmVar3,"in");
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"VTX_OUT",&local_79);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_78);
    std::__cxx11::string::operator=((string *)pmVar3,"out");
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"FRAG_IN",&local_a1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar3,"in");
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"FRAG_COLOR",&local_c9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar3,"dEQP_FragColor");
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"VTX_HDR",&local_f1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar3,"#version 300 es\n");
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"FRAG_HDR",&local_119);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_118);
    std::__cxx11::string::operator=
              ((string *)pmVar3,
               "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    pmVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"COL_PRECISION",&local_141);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_140);
    std::__cxx11::string::operator=((string *)pmVar3,"mediump");
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  else {
    local_148 = params_local._4_4_;
    bVar2 = glu::isGLSLVersionSupported((ContextType)params_local._4_4_,GLSL_VERSION_100_ES);
    pmVar1 = local_18;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"VTX_IN",&local_169);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_168);
      std::__cxx11::string::operator=((string *)pmVar3,"attribute");
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"VTX_OUT",&local_191);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_190);
      std::__cxx11::string::operator=((string *)pmVar3,"varying");
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"FRAG_IN",&local_1b9);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1b8);
      std::__cxx11::string::operator=((string *)pmVar3,"varying");
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"FRAG_COLOR",&local_1e1);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1e0);
      std::__cxx11::string::operator=((string *)pmVar3,"gl_FragColor");
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"VTX_HDR",&local_209);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_208);
      std::__cxx11::string::operator=((string *)pmVar3,"");
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"FRAG_HDR",&local_231)
      ;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_230);
      std::__cxx11::string::operator=((string *)pmVar3,"");
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      pmVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"COL_PRECISION",&local_259);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_258);
      std::__cxx11::string::operator=((string *)pmVar3,"mediump");
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
    }
    else {
      local_260.m_bits = params_local._4_4_;
      bVar2 = glu::isGLSLVersionSupported((ContextType)params_local._4_4_,GLSL_VERSION_430);
      pmVar1 = local_18;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"VTX_IN",&local_281)
        ;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_280);
        std::__cxx11::string::operator=((string *)pmVar3,"in");
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"VTX_OUT",&local_2a9);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_2a8);
        std::__cxx11::string::operator=((string *)pmVar3,"out");
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"FRAG_IN",&local_2d1);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_2d0);
        std::__cxx11::string::operator=((string *)pmVar3,"in");
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"FRAG_COLOR",&local_2f9);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_2f8);
        std::__cxx11::string::operator=((string *)pmVar3,"dEQP_FragColor");
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_2f9);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,"VTX_HDR",&local_321);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_320);
        std::__cxx11::string::operator=((string *)pmVar3,"#version 430\n");
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator(&local_321);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"FRAG_HDR",&local_349);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_348);
        std::__cxx11::string::operator=
                  ((string *)pmVar3,
                   "#version 430\nlayout(location = 0) out highp vec4 dEQP_FragColor;\n");
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
        pmVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"COL_PRECISION",&local_371);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_370);
        std::__cxx11::string::operator=((string *)pmVar3,"highp");
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
      }
      else {
        local_378 = params_local._4_4_;
        bVar2 = glu::isGLSLVersionSupported((ContextType)params_local._4_4_,GLSL_VERSION_330);
        pmVar1 = local_18;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,"VTX_IN",&local_399);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_398);
          std::__cxx11::string::operator=((string *)pmVar3,"in");
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator(&local_399);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c0,"VTX_OUT",&local_3c1);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_3c0);
          std::__cxx11::string::operator=((string *)pmVar3,"out");
          std::__cxx11::string::~string((string *)&local_3c0);
          std::allocator<char>::~allocator(&local_3c1);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"FRAG_IN",&local_3e9);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_3e8);
          std::__cxx11::string::operator=((string *)pmVar3,"in");
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410,"FRAG_COLOR",&local_411);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_410);
          std::__cxx11::string::operator=((string *)pmVar3,"dEQP_FragColor");
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator(&local_411);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_438,"VTX_HDR",&local_439);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_438);
          std::__cxx11::string::operator=((string *)pmVar3,"#version 330\n");
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator(&local_439);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_460,"FRAG_HDR",&local_461);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_460);
          std::__cxx11::string::operator=
                    ((string *)pmVar3,
                     "#version 330\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n");
          std::__cxx11::string::~string((string *)&local_460);
          std::allocator<char>::~allocator(&local_461);
          pmVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,"COL_PRECISION",&local_489);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_488);
          std::__cxx11::string::operator=((string *)pmVar3,"mediump");
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
        }
      }
    }
  }
  return;
}

Assistant:

void DrawTestShaderProgram::generateShaderParams (std::map<std::string, std::string>& params, glu::ContextType type)
{
	if (glu::isGLSLVersionSupported(type, glu::GLSL_VERSION_300_ES))
	{
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
		params["VTX_HDR"]		= "#version 300 es\n";
		params["FRAG_HDR"]		= "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		params["COL_PRECISION"]	= "mediump";
	}
	else if (glu::isGLSLVersionSupported(type, glu::GLSL_VERSION_100_ES))
	{
		params["VTX_IN"]		= "attribute";
		params["VTX_OUT"]		= "varying";
		params["FRAG_IN"]		= "varying";
		params["FRAG_COLOR"]	= "gl_FragColor";
		params["VTX_HDR"]		= "";
		params["FRAG_HDR"]		= "";
		params["COL_PRECISION"]	= "mediump";
	}
	else if (glu::isGLSLVersionSupported(type, glu::GLSL_VERSION_430))
	{
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
		params["VTX_HDR"]		= "#version 430\n";
		params["FRAG_HDR"]		= "#version 430\nlayout(location = 0) out highp vec4 dEQP_FragColor;\n";
		params["COL_PRECISION"]	= "highp";
	}
	else if (glu::isGLSLVersionSupported(type, glu::GLSL_VERSION_330))
	{
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
		params["VTX_HDR"]		= "#version 330\n";
		params["FRAG_HDR"]		= "#version 330\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		params["COL_PRECISION"]	= "mediump";
	}
	else
		DE_ASSERT(DE_FALSE);
}